

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::
ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::ValueFlag(ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,Group *group_,string *name_,string *help_,Matcher *matcher_,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue_,
           bool extraError_)

{
  Base *in_RDI;
  string *in_R9;
  undefined1 in_stack_00000008;
  undefined8 in_stack_ffffffffffffffb0;
  Group *this_00;
  Matcher *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  
  ValueFlagBase::ValueFlagBase
            ((ValueFlagBase *)in_R9,
             (string *)(CONCAT17(in_stack_00000008,in_stack_ffffffffffffffc8) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0));
  in_RDI->_vptr_Base = (_func_int **)&PTR__ValueFlag_0018bb80;
  this_00 = (Group *)&in_RDI[4].matched;
  std::__cxx11::string::string((string *)this_00,in_R9);
  Group::Add(this_00,in_RDI);
  return;
}

Assistant:

ValueFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, const T &defaultValue_ = T(), const bool extraError_ = false): ValueFlagBase(name_, help_, std::move(matcher_), extraError_), value(defaultValue_)
            {
                group_.Add(*this);
            }